

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenAddressField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcAddressType addressType,U64 addressBytes,U8 value)

{
  uint uVar1;
  U8 extValue;
  value_type local_32;
  value_type local_31;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (addressType == HDLC_BASIC_ADDRESS_FIELD) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_31);
  }
  else {
    for (uVar1 = 0; uVar1 < addressBytes; uVar1 = uVar1 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_32);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenAddressField( HdlcAddressType addressType, U64 addressBytes, U8 value ) const
{
    vector<U8> addrRet;
    if( addressType == HDLC_BASIC_ADDRESS_FIELD )
    {
        addrRet.push_back( value );
    }
    else // addressType == HDLC_EXTENDED_ADDRESS_FIELD
    {
        for( U32 i = 0; i < addressBytes; ++i )
        {
            U8 mask = ( i == addressBytes - 1 ) ? 0x00 : 0x01; // EA bit (Lsb is set to 1 to extend the address recursively)
            U8 extValue = ( value & 0xFE ) | mask;
            addrRet.push_back( extValue );
        }
    }
    return addrRet;
}